

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmLocalUnixMakefileGenerator3::WriteLocalMakefile(cmLocalUnixMakefileGenerator3 *this)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  char *pcVar5;
  pointer ppVar6;
  pointer pLVar7;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar8;
  cmGlobalUnixMakefileGenerator3 *gg_1;
  allocator local_419;
  value_type local_418;
  _Base_ptr local_3f8;
  undefined1 local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  undefined1 local_3c8 [8];
  string base_1;
  size_type dot_pos_1;
  undefined1 local_380 [8];
  string base;
  size_type dot_pos;
  __normal_iterator<cmLocalUnixMakefileGenerator3::LocalObjectEntry_*,_std::vector<cmLocalUnixMakefileGenerator3::LocalObjectEntry,_std::allocator<cmLocalUnixMakefileGenerator3::LocalObjectEntry>_>_>
  local_350;
  __normal_iterator<const_cmLocalUnixMakefileGenerator3::LocalObjectEntry_*,_std::vector<cmLocalUnixMakefileGenerator3::LocalObjectEntry,_std::allocator<cmLocalUnixMakefileGenerator3::LocalObjectEntry>_>_>
  local_348;
  const_iterator ei;
  bool lang_has_assembly;
  iterator iStack_338;
  bool lang_has_preprocessor;
  _Self local_330;
  iterator lo;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
  localObjectFiles;
  bool do_assembly_rules;
  bool do_preprocess_rules;
  cmGlobalUnixMakefileGenerator3 *gg;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emittedTargets;
  undefined1 local_2b0 [8];
  cmGeneratedFileStream ruleFileStream;
  string ruleFileNameFull;
  allocator local_31;
  undefined1 local_30 [8];
  string ruleFileName;
  cmLocalUnixMakefileGenerator3 *this_local;
  
  ruleFileName.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_30,"Makefile",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  ConvertToFullPath((string *)&ruleFileStream.field_0x240,this,(string *)local_30);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_2b0,pcVar5,false);
  bVar1 = std::ios::operator!((ios *)(local_2b0 + (long)*(_func_int **)((long)local_2b0 + -0x18)));
  if ((bVar1 & 1) == 0) {
    if ((this->super_cmLocalGenerator).Parent != (cmLocalGenerator *)0x0) {
      cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_2b0,true);
    }
    WriteLocalAllRules(this,(ostream *)local_2b0);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&gg);
    if ((this->super_cmLocalGenerator).Parent == (cmLocalGenerator *)0x0) {
      cmGlobalUnixMakefileGenerator3::WriteConvenienceRules
                ((cmGlobalUnixMakefileGenerator3 *)(this->super_cmLocalGenerator).GlobalGenerator,
                 (ostream *)local_2b0,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&gg);
    }
    else {
      WriteLocalMakefileTargets
                (this,(ostream *)local_2b0,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&gg);
    }
    bVar2 = GetCreatePreprocessedSourceRules(this);
    bVar3 = GetCreateAssemblySourceRules(this);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
           *)&lo);
    GetLocalObjectFiles(this,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
                              *)&lo);
    local_330._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
                  *)&lo);
    while( true ) {
      iStack_338 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
                   ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
                          *)&lo);
      bVar4 = std::operator!=(&local_330,&stack0xfffffffffffffcc8);
      if (!bVar4) break;
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>
      ::operator->(&local_330);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>
               ::operator->(&local_330);
      WriteObjectConvenienceRule
                (this,(ostream *)local_2b0,"target to build an object file",pcVar5,&ppVar6->second);
      ei._M_current._7_1_ = 0;
      ei._M_current._6_1_ = 0;
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>
               ::operator->(&local_330);
      local_350._M_current =
           (LocalObjectEntry *)
           std::
           vector<cmLocalUnixMakefileGenerator3::LocalObjectEntry,_std::allocator<cmLocalUnixMakefileGenerator3::LocalObjectEntry>_>
           ::begin(&(ppVar6->second).
                    super_vector<cmLocalUnixMakefileGenerator3::LocalObjectEntry,_std::allocator<cmLocalUnixMakefileGenerator3::LocalObjectEntry>_>
                  );
      __gnu_cxx::
      __normal_iterator<cmLocalUnixMakefileGenerator3::LocalObjectEntry_const*,std::vector<cmLocalUnixMakefileGenerator3::LocalObjectEntry,std::allocator<cmLocalUnixMakefileGenerator3::LocalObjectEntry>>>
      ::__normal_iterator<cmLocalUnixMakefileGenerator3::LocalObjectEntry*>
                ((__normal_iterator<cmLocalUnixMakefileGenerator3::LocalObjectEntry_const*,std::vector<cmLocalUnixMakefileGenerator3::LocalObjectEntry,std::allocator<cmLocalUnixMakefileGenerator3::LocalObjectEntry>>>
                  *)&local_348,&local_350);
      while( true ) {
        ppVar6 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>
                 ::operator->(&local_330);
        dot_pos = (size_type)
                  std::
                  vector<cmLocalUnixMakefileGenerator3::LocalObjectEntry,_std::allocator<cmLocalUnixMakefileGenerator3::LocalObjectEntry>_>
                  ::end(&(ppVar6->second).
                         super_vector<cmLocalUnixMakefileGenerator3::LocalObjectEntry,_std::allocator<cmLocalUnixMakefileGenerator3::LocalObjectEntry>_>
                       );
        bVar4 = __gnu_cxx::operator!=
                          (&local_348,
                           (__normal_iterator<cmLocalUnixMakefileGenerator3::LocalObjectEntry_*,_std::vector<cmLocalUnixMakefileGenerator3::LocalObjectEntry,_std::allocator<cmLocalUnixMakefileGenerator3::LocalObjectEntry>_>_>
                            *)&dot_pos);
        if (!bVar4) break;
        pLVar7 = __gnu_cxx::
                 __normal_iterator<const_cmLocalUnixMakefileGenerator3::LocalObjectEntry_*,_std::vector<cmLocalUnixMakefileGenerator3::LocalObjectEntry,_std::allocator<cmLocalUnixMakefileGenerator3::LocalObjectEntry>_>_>
                 ::operator->(&local_348);
        bVar4 = std::operator==(&pLVar7->Language,"C");
        if (bVar4) {
LAB_00861311:
          ei._M_current._7_1_ = 1;
          ei._M_current._6_1_ = 1;
          break;
        }
        pLVar7 = __gnu_cxx::
                 __normal_iterator<const_cmLocalUnixMakefileGenerator3::LocalObjectEntry_*,_std::vector<cmLocalUnixMakefileGenerator3::LocalObjectEntry,_std::allocator<cmLocalUnixMakefileGenerator3::LocalObjectEntry>_>_>
                 ::operator->(&local_348);
        bVar4 = std::operator==(&pLVar7->Language,"CXX");
        if (bVar4) goto LAB_00861311;
        pLVar7 = __gnu_cxx::
                 __normal_iterator<const_cmLocalUnixMakefileGenerator3::LocalObjectEntry_*,_std::vector<cmLocalUnixMakefileGenerator3::LocalObjectEntry,_std::allocator<cmLocalUnixMakefileGenerator3::LocalObjectEntry>_>_>
                 ::operator->(&local_348);
        bVar4 = std::operator==(&pLVar7->Language,"Fortran");
        if (bVar4) goto LAB_00861311;
        __gnu_cxx::
        __normal_iterator<const_cmLocalUnixMakefileGenerator3::LocalObjectEntry_*,_std::vector<cmLocalUnixMakefileGenerator3::LocalObjectEntry,_std::allocator<cmLocalUnixMakefileGenerator3::LocalObjectEntry>_>_>
        ::operator++(&local_348);
      }
      if (((ei._M_current._7_1_ & 1) != 0) && (bVar2)) {
        ppVar6 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>
                 ::operator->(&local_330);
        base.field_2._8_8_ = std::__cxx11::string::rfind((char *)ppVar6,0xa6812e);
        ppVar6 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>
                 ::operator->(&local_330);
        std::__cxx11::string::substr((ulong)local_380,(ulong)ppVar6);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &dot_pos_1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_380,".i");
        pcVar5 = (char *)std::__cxx11::string::c_str();
        ppVar6 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>
                 ::operator->(&local_330);
        WriteObjectConvenienceRule
                  (this,(ostream *)local_2b0,"target to preprocess a source file",pcVar5,
                   &ppVar6->second);
        std::__cxx11::string::~string((string *)&dot_pos_1);
        ppVar6 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>
                 ::operator->(&local_330);
        (ppVar6->second).HasPreprocessRule = true;
        std::__cxx11::string::~string((string *)local_380);
      }
      if (((ei._M_current._6_1_ & 1) != 0) && (bVar3)) {
        ppVar6 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>
                 ::operator->(&local_330);
        base_1.field_2._8_8_ = std::__cxx11::string::rfind((char *)ppVar6,0xa6812e);
        ppVar6 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>
                 ::operator->(&local_330);
        std::__cxx11::string::substr((ulong)local_3c8,(ulong)ppVar6);
        std::operator+(&local_3e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_3c8,".s");
        pcVar5 = (char *)std::__cxx11::string::c_str();
        ppVar6 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>
                 ::operator->(&local_330);
        WriteObjectConvenienceRule
                  (this,(ostream *)local_2b0,"target to generate assembly for a file",pcVar5,
                   &ppVar6->second);
        std::__cxx11::string::~string((string *)&local_3e8);
        ppVar6 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>
                 ::operator->(&local_330);
        (ppVar6->second).HasAssembleRule = true;
        std::__cxx11::string::~string((string *)local_3c8);
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>
      ::operator++(&local_330);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_418,"help",&local_419);
    pVar8 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&gg,&local_418);
    local_3f8 = (_Base_ptr)pVar8.first._M_node;
    local_3f0 = pVar8.second;
    std::__cxx11::string::~string((string *)&local_418);
    std::allocator<char>::~allocator((allocator<char> *)&local_419);
    if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      cmGlobalUnixMakefileGenerator3::WriteHelpRule
                ((cmGlobalUnixMakefileGenerator3 *)(this->super_cmLocalGenerator).GlobalGenerator,
                 (ostream *)local_2b0,this);
    }
    WriteSpecialTargetsBottom(this,(ostream *)local_2b0);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
            *)&lo);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&gg);
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
  }
  else {
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_2b0);
  std::__cxx11::string::~string((string *)&ruleFileStream.field_0x240);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteLocalMakefile()
{
  // generate the includes
  std::string ruleFileName = "Makefile";

  // Open the rule file.  This should be copy-if-different because the
  // rules may depend on this file itself.
  std::string ruleFileNameFull = this->ConvertToFullPath(ruleFileName);
  cmGeneratedFileStream ruleFileStream(ruleFileNameFull.c_str());
  if(!ruleFileStream)
    {
    return;
    }
  // always write the top makefile
  if (this->Parent)
    {
    ruleFileStream.SetCopyIfDifferent(true);
    }

  // write the all rules
  this->WriteLocalAllRules(ruleFileStream);

  // only write local targets unless at the top Keep track of targets already
  // listed.
  std::set<std::string> emittedTargets;
  if (this->Parent)
    {
    // write our targets, and while doing it collect up the object
    // file rules
    this->WriteLocalMakefileTargets(ruleFileStream,emittedTargets);
    }
  else
    {
    cmGlobalUnixMakefileGenerator3 *gg =
      static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);
    gg->WriteConvenienceRules(ruleFileStream,emittedTargets);
    }

  bool do_preprocess_rules =
    this->GetCreatePreprocessedSourceRules();
  bool do_assembly_rules =
    this->GetCreateAssemblySourceRules();

  std::map<std::string, LocalObjectInfo> localObjectFiles;
  this->GetLocalObjectFiles(localObjectFiles);

  // now write out the object rules
  // for each object file name
  for (std::map<std::string, LocalObjectInfo>::iterator lo =
         localObjectFiles.begin();
       lo != localObjectFiles.end(); ++lo)
    {
    // Add a convenience rule for building the object file.
    this->WriteObjectConvenienceRule(ruleFileStream,
                                     "target to build an object file",
                                     lo->first.c_str(), lo->second);

    // Check whether preprocessing and assembly rules make sense.
    // They make sense only for C and C++ sources.
    bool lang_has_preprocessor = false;
    bool lang_has_assembly = false;

    for(std::vector<LocalObjectEntry>::const_iterator ei =
          lo->second.begin(); ei != lo->second.end(); ++ei)
      {
      if(ei->Language == "C" ||
         ei->Language == "CXX" ||
         ei->Language == "Fortran")
        {
        // Right now, C, C++ and Fortran have both a preprocessor and the
        // ability to generate assembly code
        lang_has_preprocessor = true;
        lang_has_assembly = true;
        break;
        }
      }

    // Add convenience rules for preprocessed and assembly files.
    if(lang_has_preprocessor && do_preprocess_rules)
      {
      std::string::size_type dot_pos = lo->first.rfind(".");
      std::string base = lo->first.substr(0, dot_pos);
      this->WriteObjectConvenienceRule(
        ruleFileStream, "target to preprocess a source file",
       (base + ".i").c_str(), lo->second);
      lo->second.HasPreprocessRule = true;
      }

    if(lang_has_assembly && do_assembly_rules)
      {
      std::string::size_type dot_pos = lo->first.rfind(".");
      std::string base = lo->first.substr(0, dot_pos);
      this->WriteObjectConvenienceRule(
       ruleFileStream, "target to generate assembly for a file",
       (base + ".s").c_str(), lo->second);
      lo->second.HasAssembleRule = true;
      }
    }

  // add a help target as long as there isn;t a real target named help
  if(emittedTargets.insert("help").second)
    {
    cmGlobalUnixMakefileGenerator3 *gg =
      static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);
    gg->WriteHelpRule(ruleFileStream,this);
    }

  this->WriteSpecialTargetsBottom(ruleFileStream);
}